

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.hpp
# Opt level: O0

enable_if_t<std::is_unsigned<unsigned_int>::value,_unsigned_int>
burst::divceil<unsigned_int,unsigned_long>(Integer<unsigned_int> n,Integer<unsigned_long> divisor)

{
  enable_if_t<std::is_unsigned<unsigned_int>::value,_unsigned_int> eVar1;
  domain_error *this;
  Integer<unsigned_long> divisor_local;
  Integer<unsigned_int> n_local;
  
  if (divisor != 0) {
    eVar1 = detail::divceil_impl<unsigned_int,unsigned_long>(n,divisor);
    return eVar1;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error(this,anon_var_dwarf_1eced);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

constexpr auto divceil (Integer<I> n, Integer<J> divisor)
    {
        if (divisor > 0)
        {
            return detail::divceil_impl(n, divisor);
        }
        else
        {
            throw std::domain_error("Целая часть от деления на неположительное число не определена.");
        }
    }